

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

unit_data units::precise::custom::custom_count_unit(uint16_t customX)

{
  int iVar1;
  uint per_unit;
  uint iflag;
  uint eflag;
  uint16_t in_DI;
  unit_data local_c;
  
  iVar1 = bShift(in_DI,3);
  per_unit = bShiftu(in_DI,2);
  iflag = bShiftu(in_DI,1);
  eflag = bShiftu(in_DI,0);
  units::detail::unit_data::unit_data(&local_c,0,0,0,3,-3,0,-iVar1,0,0,0,per_unit,iflag,eflag,0);
  return local_c;
}

Assistant:

constexpr detail::unit_data custom_count_unit(std::uint16_t customX)
        {
            return {
                0,
                0,
                0,
                3,  // detection codes
                -3,  // detection codes
                0,
                -1 * bShift(customX, 3U),
                0,
                0,
                0,
                bShiftu(customX, 2U),
                bShiftu(customX, 1U),
                bShiftu(customX, 0U),
                0};
        }